

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O1

VRDatumPtr __thiscall MinVR::CreateVRDatumString(MinVR *this,void *pData)

{
  VRDatumString *this_00;
  undefined4 *puVar1;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar2;
  VRString local_40;
  
  this_00 = (VRDatumString *)operator_new(0x68);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*pData,*(long *)((long)pData + 8) + *pData);
  VRDatumString::VRDatumString(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(VRDatumString **)this = this_00;
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 1;
  *(undefined4 **)(this + 8) = puVar1;
  VVar2.reference = extraout_RDX;
  VVar2.pData = (VRDatum_conflict *)this;
  return VVar2;
}

Assistant:

VRDatumPtr CreateVRDatumString(void *pData) {
  VRDatumString *obj = new VRDatumString(*static_cast<VRString *>(pData));
  return VRDatumPtr(obj);
}